

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionDetector.hpp
# Opt level: O0

uint __thiscall
RegionDetector::
RegionDetectorDetector<RegionDetector::Region,_RegionDetector::RegionAllocator<RegionDetector::Region>_>
::getNeighborIdx(RegionDetectorDetector<RegionDetector::Region,_RegionDetector::RegionAllocator<RegionDetector::Region>_>
                 *this,uint currentPixel,uint width,uint height,uint edge)

{
  uint uVar1;
  uint local_28;
  uint local_24;
  uint y;
  uint x;
  uint edge_local;
  uint height_local;
  uint width_local;
  uint currentPixel_local;
  RegionDetectorDetector<RegionDetector::Region,_RegionDetector::RegionAllocator<RegionDetector::Region>_>
  *this_local;
  
  local_24 = Helpers::idxToX(currentPixel,width);
  local_28 = Helpers::idxToY(currentPixel,width);
  switch(edge) {
  case 0:
    if (local_28 != 0) {
      local_28 = local_28 - 1;
    }
    break;
  case 1:
    if (local_24 < width - 1) {
      local_24 = local_24 + 1;
    }
    break;
  case 2:
    if (local_28 < height - 1) {
      local_28 = local_28 + 1;
    }
    break;
  case 3:
    if (local_24 != 0) {
      local_24 = local_24 - 1;
    }
  }
  uVar1 = Helpers::xyToIdx(local_24,local_28,width);
  return uVar1;
}

Assistant:

unsigned int getNeighborIdx(const unsigned int currentPixel, const unsigned int  width, const unsigned int height, const unsigned int edge) {

			unsigned int x = Helpers::idxToX(currentPixel, width);
			unsigned int y = Helpers::idxToY(currentPixel, width);

			switch (edge) {
			case 0: // N
				if (y > 0) {
					y--;
				}
				break;
			case 1: // E
				if (x < width - 1) {
					x++;
				}
				break;
			case 2: // S
				if (y < height - 1) {
					y++;
				}
				break;
			case 3: // W
				if (x > 0) {
					x--;
				}
				break;
			}

			return Helpers::xyToIdx(x, y, width);
		}